

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-connection-fail.c
# Opt level: O2

void connection_fail(uv_connect_cb connect_cb)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  char *pcVar4;
  int64_t eval_b;
  int64_t eval_b_1;
  sockaddr_in server_addr;
  sockaddr_in client_addr;
  
  iVar1 = uv_ip4_addr("0.0.0.0",0,&client_addr);
  eval_b = (int64_t)iVar1;
  server_addr._0_8_ = eval_b;
  if (eval_b == 0) {
    iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&server_addr);
    eval_b = (int64_t)iVar1;
    eval_b_1 = 0;
    if (eval_b == 0) {
      uVar2 = uv_default_loop();
      iVar1 = uv_tcp_init(uVar2,&tcp);
      if (iVar1 != 0) {
        uVar2 = 99;
LAB_00119766:
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-connection-fail.c"
                ,uVar2,"!r");
        abort();
      }
      iVar1 = uv_tcp_bind(&tcp,&client_addr,0);
      eval_b = (int64_t)iVar1;
      eval_b_1 = 0;
      if (eval_b == 0) {
        iVar1 = uv_tcp_connect(&req,&tcp,&server_addr,connect_cb);
        if (iVar1 != 0) {
          uVar2 = 0x6d;
          goto LAB_00119766;
        }
        uVar2 = uv_default_loop();
        uv_run(uVar2,0);
        eval_b = 1;
        eval_b_1 = (int64_t)connect_cb_calls;
        if (eval_b_1 == 1) {
          eval_b = 1;
          eval_b_1 = (int64_t)close_cb_calls;
          if (eval_b_1 == 1) {
            return;
          }
          pcVar4 = "close_cb_calls";
          pcVar3 = "1";
          uVar2 = 0x72;
        }
        else {
          pcVar4 = "connect_cb_calls";
          pcVar3 = "1";
          uVar2 = 0x71;
        }
      }
      else {
        pcVar4 = "0";
        pcVar3 = "uv_tcp_bind(&tcp, (const struct sockaddr*) &client_addr, 0)";
        uVar2 = 0x67;
      }
    }
    else {
      pcVar4 = "0";
      pcVar3 = "uv_ip4_addr(\"127.0.0.1\", 9123, &server_addr)";
      uVar2 = 0x5f;
    }
  }
  else {
    pcVar4 = "0";
    pcVar3 = "uv_ip4_addr(\"0.0.0.0\", 0, &client_addr)";
    uVar2 = 0x5c;
    eval_b_1 = 0;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-connection-fail.c"
          ,uVar2,pcVar3,"==",pcVar4,eval_b,"==",eval_b_1);
  abort();
}

Assistant:

static void connection_fail(uv_connect_cb connect_cb) {
  struct sockaddr_in client_addr, server_addr;
  int r;

  ASSERT_OK(uv_ip4_addr("0.0.0.0", 0, &client_addr));

  /* There should be no servers listening on this port. */
  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &server_addr));

  /* Try to connect to the server and do NUM_PINGS ping-pongs. */
  r = uv_tcp_init(uv_default_loop(), &tcp);
  ASSERT(!r);

  /* We are never doing multiple reads/connects at a time anyway. so these
   * handles can be pre-initialized. */
  ASSERT_OK(uv_tcp_bind(&tcp, (const struct sockaddr*) &client_addr, 0));

  r = uv_tcp_connect(&req,
                     &tcp,
                     (const struct sockaddr*) &server_addr,
                     connect_cb);
  ASSERT(!r);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT_EQ(1, connect_cb_calls);
  ASSERT_EQ(1, close_cb_calls);
}